

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxh3.h
# Opt level: O2

XXH64_hash_t XXH_INLINE_XXH3_64bits_withSeed(void *input,size_t len,XXH64_hash_t seed)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  ulong uVar4;
  xxh_u64 xVar5;
  xxh_u64 xVar6;
  XXH64_hash_t XVar7;
  size_t in_RCX;
  ulong uVar8;
  ulong uVar9;
  xxh_u8 *pxVar10;
  long lVar11;
  xxh_u8 *secret;
  bool bVar12;
  xxh_u8 local_f0 [192];
  
  if (len < 0x11) {
    if (len < 9) {
      if (len < 4) {
        if (len == 0) {
          uVar4 = seed + 0x9e3779b185ebca87 ^ 0x8726f9105dc21ddc;
        }
        else {
          uVar4 = (seed + 0x87275a9b ^
                  (len << 8 | (ulong)*input << 0x10 |
                   (ulong)*(byte *)((long)input + (len >> 1)) << 0x18 |
                  (ulong)*(byte *)((long)input + (len - 1)))) * -0x61c8864e7a143579;
        }
        goto LAB_0010846e;
      }
      uVar3 = (uint)seed;
      uVar4 = CONCAT44(*input,*(undefined4 *)((long)input + (len - 4))) ^
              0xc73ab174c5ecd5a2 -
              ((ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                      uVar3 << 0x18) << 0x20 ^ seed);
      uVar4 = ((uVar4 >> 0x28 | uVar4 << 0x18) ^ (uVar4 >> 0xf | uVar4 << 0x31) ^ uVar4) *
              -0x604de39ae16720db;
      uVar8 = ((uVar4 >> 0x23) + len ^ uVar4) * -0x604de39ae16720db;
      uVar4 = uVar8 >> 0x1c;
      goto LAB_00108599;
    }
    uVar9 = 0xaf56bc3b0996523a - seed ^ *(ulong *)((long)input + (len - 8));
    uVar4 = seed + 0x6782737bea4239b9 ^ *input;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar9;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar4;
    uVar8 = 0x165667919e3779f9;
    uVar4 = (SUB168(auVar1 * auVar2,8) ^ SUB168(auVar1 * auVar2,0)) +
            len + uVar9 +
            (uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
             (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
             (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38);
    uVar4 = uVar4 >> 0x25 ^ uVar4;
  }
  else {
    if (len < 0x81) {
      lVar11 = len * -0x61c8864e7a143579;
      if (0x20 < len) {
        if (0x40 < len) {
          if (0x60 < len) {
            xVar5 = XXH3_mix16B((xxh_u8 *)((long)input + 0x30),kSecret + 0x60,seed);
            xVar6 = XXH3_mix16B((xxh_u8 *)((long)input + (len - 0x40)),kSecret + 0x70,seed);
            lVar11 = lVar11 + xVar6 + xVar5;
          }
          xVar5 = XXH3_mix16B((xxh_u8 *)((long)input + 0x20),kSecret + 0x40,seed);
          xVar6 = XXH3_mix16B((xxh_u8 *)((long)input + (len - 0x30)),kSecret + 0x50,seed);
          lVar11 = lVar11 + xVar6 + xVar5;
        }
        xVar5 = XXH3_mix16B((xxh_u8 *)((long)input + 0x10),kSecret + 0x20,seed);
        xVar6 = XXH3_mix16B((xxh_u8 *)((long)input + (len - 0x20)),kSecret + 0x30,seed);
        lVar11 = lVar11 + xVar6 + xVar5;
      }
      xVar5 = XXH3_mix16B((xxh_u8 *)input,kSecret,seed);
      xVar6 = XXH3_mix16B((xxh_u8 *)((long)input + (len - 0x10)),kSecret + 0x10,seed);
      uVar4 = xVar6 + xVar5 + lVar11;
LAB_0010846e:
      uVar4 = (uVar4 >> 0x25 ^ uVar4) * 0x165667919e3779f9;
      return uVar4 >> 0x20 ^ uVar4;
    }
    if (0xf0 < len) {
      if (seed == 0) {
        pxVar10 = kSecret;
      }
      else {
        pxVar10 = local_f0;
        XXH3_initCustomSecret(pxVar10,seed);
      }
      XVar7 = XXH3_hashLong_internal((xxh_u8 *)input,len,pxVar10,in_RCX);
      return XVar7;
    }
    uVar4 = len * -0x61c8864e7a143579;
    for (lVar11 = 0; lVar11 != 0x80; lVar11 = lVar11 + 0x10) {
      xVar5 = XXH3_mix16B((xxh_u8 *)((long)input + lVar11),kSecret + lVar11,seed);
      uVar4 = uVar4 + xVar5;
    }
    secret = kSecret + 3;
    lVar11 = (len >> 4) - 8;
    pxVar10 = (xxh_u8 *)((long)input + 0x80);
    uVar4 = (uVar4 >> 0x25 ^ uVar4) * 0x165667919e3779f9;
    uVar4 = uVar4 >> 0x20 ^ uVar4;
    while (bVar12 = lVar11 != 0, lVar11 = lVar11 + -1, bVar12) {
      xVar5 = XXH3_mix16B(pxVar10,secret,seed);
      uVar4 = uVar4 + xVar5;
      secret = secret + 0x10;
      pxVar10 = pxVar10 + 0x10;
    }
    xVar5 = XXH3_mix16B((xxh_u8 *)((long)input + (len - 0x10)),kSecret + 0x77,seed);
    uVar8 = xVar5 + uVar4 >> 0x25 ^ xVar5 + uVar4;
    uVar4 = 0x165667919e3779f9;
  }
  uVar8 = uVar8 * uVar4;
  uVar4 = uVar8 >> 0x20;
LAB_00108599:
  return uVar4 ^ uVar8;
}

Assistant:

XXH_PUBLIC_API XXH64_hash_t
XXH3_64bits_withSeed(const void* input, size_t len, XXH64_hash_t seed)
{
    if (len <= 16) return XXH3_len_0to16_64b((const xxh_u8*)input, len, kSecret, seed);
    if (len <= 128) return XXH3_len_17to128_64b((const xxh_u8*)input, len, kSecret, sizeof(kSecret), seed);
    if (len <= XXH3_MIDSIZE_MAX) return XXH3_len_129to240_64b((const xxh_u8*)input, len, kSecret, sizeof(kSecret), seed);
    return XXH3_hashLong_64b_withSeed((const xxh_u8*)input, len, seed);
}